

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsInteractionTestUtil.cpp
# Opt level: O3

void deqp::gls::InteractionTestUtil::computeRandomRenderState
               (Random *rnd,RenderState *state,ApiType apiType,int targetWidth,int targetHeight)

{
  uint uVar1;
  deUint32 dVar2;
  RenderState *pRVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  deUint32 dVar6;
  undefined8 uVar7;
  int ndx;
  int iVar8;
  long lVar9;
  int iVar10;
  deUint32 *last;
  deUint32 *first;
  float fVar11;
  uint val;
  uint local_60;
  undefined4 uStack_5c;
  undefined8 uStack_58;
  uint local_50;
  deUint32 local_4c;
  RenderState *local_48;
  deUint32 local_3c;
  ulong local_38;
  
  local_3c = apiType.m_bits;
  fVar11 = deRandom_getFloat(&rnd->m_rnd);
  state->scissorTestEnabled = fVar11 < 0.2;
  fVar11 = deRandom_getFloat(&rnd->m_rnd);
  state->stencilTestEnabled = fVar11 < 0.4;
  fVar11 = deRandom_getFloat(&rnd->m_rnd);
  state->depthTestEnabled = fVar11 < 0.6;
  fVar11 = deRandom_getFloat(&rnd->m_rnd);
  state->blendEnabled = fVar11 < 0.4;
  fVar11 = deRandom_getFloat(&rnd->m_rnd);
  state->ditherEnabled = fVar11 < 0.5;
  local_48 = state;
  if (state->scissorTestEnabled == true) {
    fVar11 = ceilf((float)targetWidth * 0.7);
    iVar10 = (int)fVar11;
    local_50 = targetHeight;
    fVar11 = ceilf((float)targetHeight * 0.7);
    local_4c = deRandom_getUint32(&rnd->m_rnd);
    uVar1 = local_50;
    if (targetWidth != 0x7fffffeb || iVar10 != -0x80000000) {
      local_4c = local_4c % ((targetWidth - iVar10) + 0x15U) + iVar10;
    }
    local_38 = (ulong)(uint)(int)fVar11;
    dVar4 = deRandom_getUint32(&rnd->m_rnd);
    iVar10 = -0x80000000;
    if (uVar1 != 0x7fffffeb || (int)fVar11 != 0x80000000) {
      iVar10 = uVar1 + 0x15;
      dVar4 = dVar4 % (uint)(iVar10 - (int)local_38) + (int)local_38;
    }
    dVar5 = deRandom_getUint32(&rnd->m_rnd);
    dVar2 = local_4c;
    iVar8 = targetWidth - local_4c;
    dVar6 = deRandom_getUint32(&rnd->m_rnd);
    (local_48->scissorRectangle).left = dVar5 % (iVar8 + 0x15U) - 10;
    (local_48->scissorRectangle).bottom = dVar6 % (iVar10 - dVar4) - 10;
    (local_48->scissorRectangle).width = dVar2;
    (local_48->scissorRectangle).height = dVar4;
  }
  pRVar3 = local_48;
  if (local_48->stencilTestEnabled == true) {
    uVar7 = CONCAT71((int7)((ulong)local_48 >> 8),1);
    lVar9 = 0;
    do {
      local_50 = (uint)uVar7;
      local_60 = 0;
      de::Random::choose<unsigned_int_const*,unsigned_int*>
                (rnd,computeRandomRenderState::compareFuncs,computeRandomRenderState::stencilOps,
                 &local_60,1);
      pRVar3->stencil[lVar9].function = local_60;
      dVar4 = deRandom_getUint32(&rnd->m_rnd);
      pRVar3->stencil[lVar9].reference =
           (dVar4 - ((dVar4 / 0x108) * 0x100 + (dVar4 / 0x108) * 8)) + -3;
      dVar4 = deRandom_getUint32(&rnd->m_rnd);
      pRVar3->stencil[lVar9].compareMask = dVar4;
      local_60 = 0;
      de::Random::choose<unsigned_int_const*,unsigned_int*>
                (rnd,computeRandomRenderState::stencilOps,computeRandomRenderState::blendEquations,
                 &local_60,1);
      pRVar3->stencil[lVar9].stencilFailOp = local_60;
      local_60 = 0;
      de::Random::choose<unsigned_int_const*,unsigned_int*>
                (rnd,computeRandomRenderState::stencilOps,computeRandomRenderState::blendEquations,
                 &local_60,1);
      pRVar3->stencil[lVar9].depthFailOp = local_60;
      local_60 = 0;
      de::Random::choose<unsigned_int_const*,unsigned_int*>
                (rnd,computeRandomRenderState::stencilOps,computeRandomRenderState::blendEquations,
                 &local_60,1);
      pRVar3->stencil[lVar9].depthPassOp = local_60;
      dVar4 = deRandom_getUint32(&rnd->m_rnd);
      pRVar3->stencil[lVar9].writeMask = dVar4;
      lVar9 = 1;
      uVar7 = 0;
    } while ((local_50 & 1) != 0);
  }
  pRVar3 = local_48;
  if (local_48->depthTestEnabled == true) {
    local_60 = 0;
    de::Random::choose<unsigned_int_const*,unsigned_int*>
              (rnd,computeRandomRenderState::compareFuncs,computeRandomRenderState::stencilOps,
               &local_60,1);
    pRVar3->depthFunc = local_60;
    fVar11 = deRandom_getFloat(&rnd->m_rnd);
    pRVar3->depthWriteMask = fVar11 < 0.7;
  }
  if (pRVar3->blendEnabled == true) {
    if (local_3c == 2) {
      local_60 = 0;
      de::Random::choose<unsigned_int_const*,unsigned_int*>
                (rnd,computeRandomRenderState::blendEquationsES2,(uint *)&DAT_01cbbb58,&local_60,1);
      (pRVar3->blendRGBState).equation = local_60;
      local_60 = 0;
      de::Random::choose<unsigned_int_const*,unsigned_int*>
                (rnd,computeRandomRenderState::blendFuncs,
                 computeRandomRenderState::blendEquationsES2,&local_60,1);
      (pRVar3->blendRGBState).srcFunc = local_60;
      local_60 = 0;
      first = computeRandomRenderState::blendFuncsDstES2;
      last = (deUint32 *)&DAT_01cbbb98;
      de::Random::choose<unsigned_int_const*,unsigned_int*>
                (rnd,computeRandomRenderState::blendFuncsDstES2,(uint *)&DAT_01cbbb98,&local_60,1);
      (pRVar3->blendRGBState).dstFunc = local_60;
      local_60 = 0;
      de::Random::choose<unsigned_int_const*,unsigned_int*>
                (rnd,computeRandomRenderState::blendEquationsES2,(uint *)&DAT_01cbbb58,&local_60,1);
      (pRVar3->blendAState).equation = local_60;
    }
    else {
      local_60 = 0;
      de::Random::choose<unsigned_int_const*,unsigned_int*>
                (rnd,computeRandomRenderState::blendEquations,(uint *)&DAT_01cbbb04,&local_60,1);
      (pRVar3->blendRGBState).equation = local_60;
      local_60 = 0;
      first = computeRandomRenderState::blendFuncs;
      last = computeRandomRenderState::blendEquationsES2;
      de::Random::choose<unsigned_int_const*,unsigned_int*>
                (rnd,computeRandomRenderState::blendFuncs,
                 computeRandomRenderState::blendEquationsES2,&local_60,1);
      (pRVar3->blendRGBState).srcFunc = local_60;
      local_60 = 0;
      de::Random::choose<unsigned_int_const*,unsigned_int*>
                (rnd,computeRandomRenderState::blendFuncs,
                 computeRandomRenderState::blendEquationsES2,&local_60,1);
      (pRVar3->blendRGBState).dstFunc = local_60;
      local_60 = 0;
      de::Random::choose<unsigned_int_const*,unsigned_int*>
                (rnd,computeRandomRenderState::blendEquations,(uint *)&DAT_01cbbb04,&local_60,1);
      (pRVar3->blendAState).equation = local_60;
    }
    local_60 = 0;
    de::Random::choose<unsigned_int_const*,unsigned_int*>
              (rnd,computeRandomRenderState::blendFuncs,computeRandomRenderState::blendEquationsES2,
               &local_60,1);
    (pRVar3->blendAState).srcFunc = local_60;
    local_60 = 0;
    de::Random::choose<unsigned_int_const*,unsigned_int*>(rnd,first,last,&local_60,1);
    (pRVar3->blendAState).dstFunc = local_60;
    getRandomColor((InteractionTestUtil *)&local_60,rnd);
    *(ulong *)(pRVar3->blendColor).m_data = CONCAT44(uStack_5c,local_60);
    *(undefined8 *)((pRVar3->blendColor).m_data + 2) = uStack_58;
  }
  lVar9 = 0;
  do {
    fVar11 = deRandom_getFloat(&rnd->m_rnd);
    (pRVar3->colorMask).m_data[lVar9] = fVar11 < 0.7;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 4);
  return;
}

Assistant:

void computeRandomRenderState (de::Random& rnd, RenderState& state, glu::ApiType apiType, int targetWidth, int targetHeight)
{
	// Constants governing randomization.
	const float		scissorTestProbability		= 0.2f;
	const float		stencilTestProbability		= 0.4f;
	const float		depthTestProbability		= 0.6f;
	const float		blendProbability			= 0.4f;
	const float		ditherProbability			= 0.5f;

	const float		depthWriteProbability		= 0.7f;
	const float		colorWriteProbability		= 0.7f;

	const int		minStencilVal				= -3;
	const int		maxStencilVal				= 260;

	const int		maxScissorOutOfBounds		= 10;
	const float		minScissorSize				= 0.7f;

	static const deUint32 compareFuncs[] =
	{
		GL_NEVER,
		GL_ALWAYS,
		GL_LESS,
		GL_LEQUAL,
		GL_EQUAL,
		GL_GEQUAL,
		GL_GREATER,
		GL_NOTEQUAL
	};

	static const deUint32 stencilOps[] =
	{
		GL_KEEP,
		GL_ZERO,
		GL_REPLACE,
		GL_INCR,
		GL_DECR,
		GL_INVERT,
		GL_INCR_WRAP,
		GL_DECR_WRAP
	};

	static const deUint32 blendEquations[] =
	{
		GL_FUNC_ADD,
		GL_FUNC_SUBTRACT,
		GL_FUNC_REVERSE_SUBTRACT,
		GL_MIN,
		GL_MAX
	};

	static const deUint32 blendFuncs[] =
	{
		GL_ZERO,
		GL_ONE,
		GL_SRC_COLOR,
		GL_ONE_MINUS_SRC_COLOR,
		GL_DST_COLOR,
		GL_ONE_MINUS_DST_COLOR,
		GL_SRC_ALPHA,
		GL_ONE_MINUS_SRC_ALPHA,
		GL_DST_ALPHA,
		GL_ONE_MINUS_DST_ALPHA,
		GL_CONSTANT_COLOR,
		GL_ONE_MINUS_CONSTANT_COLOR,
		GL_CONSTANT_ALPHA,
		GL_ONE_MINUS_CONSTANT_ALPHA,
		GL_SRC_ALPHA_SATURATE
	};

	static const deUint32 blendEquationsES2[] =
	{
		GL_FUNC_ADD,
		GL_FUNC_SUBTRACT,
		GL_FUNC_REVERSE_SUBTRACT
	};

	static const deUint32 blendFuncsDstES2[] =
	{
		GL_ZERO,
		GL_ONE,
		GL_SRC_COLOR,
		GL_ONE_MINUS_SRC_COLOR,
		GL_DST_COLOR,
		GL_ONE_MINUS_DST_COLOR,
		GL_SRC_ALPHA,
		GL_ONE_MINUS_SRC_ALPHA,
		GL_DST_ALPHA,
		GL_ONE_MINUS_DST_ALPHA,
		GL_CONSTANT_COLOR,
		GL_ONE_MINUS_CONSTANT_COLOR,
		GL_CONSTANT_ALPHA,
		GL_ONE_MINUS_CONSTANT_ALPHA
	};

	state.scissorTestEnabled	= rnd.getFloat() < scissorTestProbability;
	state.stencilTestEnabled	= rnd.getFloat() < stencilTestProbability;
	state.depthTestEnabled		= rnd.getFloat() < depthTestProbability;
	state.blendEnabled			= rnd.getFloat() < blendProbability;
	state.ditherEnabled			= rnd.getFloat() < ditherProbability;

	if (state.scissorTestEnabled)
	{
		int minScissorW		= deCeilFloatToInt32(minScissorSize * (float)targetWidth);
		int minScissorH		= deCeilFloatToInt32(minScissorSize * (float)targetHeight);
		int maxScissorW		= targetWidth + 2*maxScissorOutOfBounds;
		int maxScissorH		= targetHeight + 2*maxScissorOutOfBounds;

		int scissorW		= rnd.getInt(minScissorW, maxScissorW);
		int	scissorH		= rnd.getInt(minScissorH, maxScissorH);
		int scissorX		= rnd.getInt(-maxScissorOutOfBounds, targetWidth+maxScissorOutOfBounds-scissorW);
		int scissorY		= rnd.getInt(-maxScissorOutOfBounds, targetHeight+maxScissorOutOfBounds-scissorH);

		state.scissorRectangle = rr::WindowRectangle(scissorX, scissorY, scissorW, scissorH);
	}

	if (state.stencilTestEnabled)
	{
		for (int ndx = 0; ndx < 2; ndx++)
		{
			state.stencil[ndx].function			= rnd.choose<deUint32>(DE_ARRAY_BEGIN(compareFuncs), DE_ARRAY_END(compareFuncs));
			state.stencil[ndx].reference		= rnd.getInt(minStencilVal, maxStencilVal);
			state.stencil[ndx].compareMask		= rnd.getUint32();
			state.stencil[ndx].stencilFailOp	= rnd.choose<deUint32>(DE_ARRAY_BEGIN(stencilOps), DE_ARRAY_END(stencilOps));
			state.stencil[ndx].depthFailOp		= rnd.choose<deUint32>(DE_ARRAY_BEGIN(stencilOps), DE_ARRAY_END(stencilOps));
			state.stencil[ndx].depthPassOp		= rnd.choose<deUint32>(DE_ARRAY_BEGIN(stencilOps), DE_ARRAY_END(stencilOps));
			state.stencil[ndx].writeMask		= rnd.getUint32();
		}
	}

	if (state.depthTestEnabled)
	{
		state.depthFunc			= rnd.choose<deUint32>(DE_ARRAY_BEGIN(compareFuncs), DE_ARRAY_END(compareFuncs));
		state.depthWriteMask	= rnd.getFloat() < depthWriteProbability;
	}

	if (state.blendEnabled)
	{
		if (apiType == glu::ApiType::es(2,0))
		{
			state.blendRGBState.equation	= rnd.choose<deUint32>(DE_ARRAY_BEGIN(blendEquationsES2), DE_ARRAY_END(blendEquationsES2));
			state.blendRGBState.srcFunc		= rnd.choose<deUint32>(DE_ARRAY_BEGIN(blendFuncs), DE_ARRAY_END(blendFuncs));
			state.blendRGBState.dstFunc		= rnd.choose<deUint32>(DE_ARRAY_BEGIN(blendFuncsDstES2), DE_ARRAY_END(blendFuncsDstES2));

			state.blendAState.equation		= rnd.choose<deUint32>(DE_ARRAY_BEGIN(blendEquationsES2), DE_ARRAY_END(blendEquationsES2));
			state.blendAState.srcFunc		= rnd.choose<deUint32>(DE_ARRAY_BEGIN(blendFuncs), DE_ARRAY_END(blendFuncs));
			state.blendAState.dstFunc		= rnd.choose<deUint32>(DE_ARRAY_BEGIN(blendFuncsDstES2), DE_ARRAY_END(blendFuncsDstES2));
		}
		else
		{
			state.blendRGBState.equation	= rnd.choose<deUint32>(DE_ARRAY_BEGIN(blendEquations), DE_ARRAY_END(blendEquations));
			state.blendRGBState.srcFunc		= rnd.choose<deUint32>(DE_ARRAY_BEGIN(blendFuncs), DE_ARRAY_END(blendFuncs));
			state.blendRGBState.dstFunc		= rnd.choose<deUint32>(DE_ARRAY_BEGIN(blendFuncs), DE_ARRAY_END(blendFuncs));

			state.blendAState.equation		= rnd.choose<deUint32>(DE_ARRAY_BEGIN(blendEquations), DE_ARRAY_END(blendEquations));
			state.blendAState.srcFunc		= rnd.choose<deUint32>(DE_ARRAY_BEGIN(blendFuncs), DE_ARRAY_END(blendFuncs));
			state.blendAState.dstFunc		= rnd.choose<deUint32>(DE_ARRAY_BEGIN(blendFuncs), DE_ARRAY_END(blendFuncs));
		}

		state.blendColor				= getRandomColor(rnd);
	}

	for (int ndx = 0; ndx < 4; ndx++)
		state.colorMask[ndx] = rnd.getFloat() < colorWriteProbability;
}